

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFLTKWrapUICommand.cxx
# Opt level: O3

bool __thiscall
cmFLTKWrapUICommand::InitialPass
          (cmFLTKWrapUICommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer *pppcVar1;
  cmMakefile *this_00;
  iterator __position;
  pointer pcVar2;
  bool bVar3;
  char *pcVar4;
  char *pcVar5;
  cmSourceFile *pcVar6;
  long *plVar7;
  pointer ppcVar8;
  string *psVar9;
  size_type *psVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  allocator local_1b9;
  string no_main_dependency;
  string sourceListValue;
  string outputDirectory;
  string varName;
  string cxxres;
  string origname;
  cmSourceFile *sf;
  value_type local_e8;
  string cdir;
  cmCustomCommandLine commandLine;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  cmCustomCommandLines commandLines;
  
  uVar12 = (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
  if (uVar12 < 0x21) {
    cdir._M_dataplus._M_p = (pointer)&cdir.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&cdir,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&cdir);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cdir._M_dataplus._M_p == &cdir.field_2) goto LAB_0032163f;
  }
  else {
    pcVar4 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
    std::__cxx11::string::string((string *)&cdir,pcVar4,(allocator *)&outputDirectory);
    this_00 = (this->super_cmCommand).Makefile;
    outputDirectory._M_dataplus._M_p = (pointer)&outputDirectory.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&outputDirectory,"FLTK_FLUID_EXECUTABLE","");
    pcVar4 = cmMakefile::GetRequiredDefinition(this_00,&outputDirectory);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)outputDirectory._M_dataplus._M_p != &outputDirectory.field_2) {
      operator_delete(outputDirectory._M_dataplus._M_p,
                      outputDirectory.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_assign((string *)&this->Target);
    pcVar5 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
    std::__cxx11::string::string((string *)&outputDirectory,pcVar5,(allocator *)&sourceListValue);
    sourceListValue._M_dataplus._M_p = (pointer)0x0;
    sourceListValue._M_string_length = 0;
    sourceListValue.field_2._M_allocated_capacity = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&sourceListValue,&outputDirectory);
    cmMakefile::AddIncludeDirectories
              ((this->super_cmCommand).Makefile,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&sourceListValue,false);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&sourceListValue);
    psVar9 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 1;
    if (psVar9 != (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      do {
        pcVar6 = cmMakefile::GetSource((this->super_cmCommand).Makefile,psVar9);
        if (pcVar6 == (cmSourceFile *)0x0) {
LAB_00320ea0:
          sourceListValue._M_dataplus._M_p = (pointer)&sourceListValue.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&sourceListValue,outputDirectory._M_dataplus._M_p,
                     outputDirectory._M_dataplus._M_p + outputDirectory._M_string_length);
          std::__cxx11::string::append((char *)&sourceListValue);
          cmsys::SystemTools::GetFilenameWithoutExtension(&varName,psVar9);
          std::__cxx11::string::_M_append((char *)&sourceListValue,(ulong)varName._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)varName._M_dataplus._M_p != &varName.field_2) {
            operator_delete(varName._M_dataplus._M_p,varName.field_2._M_allocated_capacity + 1);
          }
          varName._M_dataplus._M_p = (pointer)&varName.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&varName,sourceListValue._M_dataplus._M_p,
                     sourceListValue._M_dataplus._M_p + sourceListValue._M_string_length);
          std::__cxx11::string::append((char *)&varName);
          cxxres._M_dataplus._M_p = (pointer)&cxxres.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&cxxres,cdir._M_dataplus._M_p,
                     cdir._M_dataplus._M_p + cdir._M_string_length);
          std::__cxx11::string::append((char *)&cxxres);
          plVar7 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&cxxres,(ulong)(psVar9->_M_dataplus)._M_p);
          psVar10 = (size_type *)(plVar7 + 2);
          if ((size_type *)*plVar7 == psVar10) {
            origname.field_2._M_allocated_capacity = *psVar10;
            origname.field_2._8_8_ = plVar7[3];
            origname._M_dataplus._M_p = (pointer)&origname.field_2;
          }
          else {
            origname.field_2._M_allocated_capacity = *psVar10;
            origname._M_dataplus._M_p = (pointer)*plVar7;
          }
          origname._M_string_length = plVar7[1];
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)cxxres._M_dataplus._M_p != &cxxres.field_2) {
            operator_delete(cxxres._M_dataplus._M_p,cxxres.field_2._M_allocated_capacity + 1);
          }
          depends.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          depends.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          depends.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&depends,&origname);
          std::__cxx11::string::string((string *)&cxxres,pcVar4,(allocator *)&no_main_dependency);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
                     &cxxres);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)cxxres._M_dataplus._M_p != &cxxres.field_2) {
            operator_delete(cxxres._M_dataplus._M_p,cxxres.field_2._M_allocated_capacity + 1);
          }
          cxxres._M_dataplus._M_p = (pointer)&cxxres.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&cxxres,sourceListValue._M_dataplus._M_p,
                     sourceListValue._M_dataplus._M_p + sourceListValue._M_string_length);
          std::__cxx11::string::append((char *)&cxxres);
          commandLine.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          commandLine.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          commandLine.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::__cxx11::string::string((string *)&no_main_dependency,pcVar4,(allocator *)&local_e8);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &commandLine,&no_main_dependency);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)no_main_dependency._M_dataplus._M_p != &no_main_dependency.field_2) {
            operator_delete(no_main_dependency._M_dataplus._M_p,
                            no_main_dependency.field_2._M_allocated_capacity + 1);
          }
          no_main_dependency._M_dataplus._M_p = (pointer)&no_main_dependency.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&no_main_dependency,"-c","");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &commandLine,&no_main_dependency);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)no_main_dependency._M_dataplus._M_p != &no_main_dependency.field_2) {
            operator_delete(no_main_dependency._M_dataplus._M_p,
                            no_main_dependency.field_2._M_allocated_capacity + 1);
          }
          no_main_dependency._M_dataplus._M_p = (pointer)&no_main_dependency.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&no_main_dependency,"-h","");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &commandLine,&no_main_dependency);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)no_main_dependency._M_dataplus._M_p != &no_main_dependency.field_2) {
            operator_delete(no_main_dependency._M_dataplus._M_p,
                            no_main_dependency.field_2._M_allocated_capacity + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&commandLine.
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ,&varName);
          no_main_dependency._M_dataplus._M_p = (pointer)&no_main_dependency.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&no_main_dependency,"-o","");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &commandLine,&no_main_dependency);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)no_main_dependency._M_dataplus._M_p != &no_main_dependency.field_2) {
            operator_delete(no_main_dependency._M_dataplus._M_p,
                            no_main_dependency.field_2._M_allocated_capacity + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&commandLine.
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ,&cxxres);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&commandLine.
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ,&origname);
          commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
          super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
          super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
          super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                    (&commandLines.
                      super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                     (value_type *)
                     &commandLine.
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    );
          no_main_dependency._M_dataplus._M_p = (pointer)&no_main_dependency.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&no_main_dependency,"");
          cmMakefile::AddCustomCommandToOutput
                    ((this->super_cmCommand).Makefile,&cxxres,&depends,&no_main_dependency,
                     &commandLines,(char *)0x0,(char *)0x0,false,true,false);
          cmMakefile::AddCustomCommandToOutput
                    ((this->super_cmCommand).Makefile,&varName,&depends,&no_main_dependency,
                     &commandLines,(char *)0x0,(char *)0x0,false,true,false);
          pcVar6 = cmMakefile::GetSource((this->super_cmCommand).Makefile,&cxxres);
          sf = pcVar6;
          std::__cxx11::string::string((string *)&local_e8,varName._M_dataplus._M_p,&local_1b9);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&pcVar6->Depends,&local_e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
          pcVar6 = sf;
          std::__cxx11::string::string((string *)&local_e8,origname._M_dataplus._M_p,&local_1b9);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&pcVar6->Depends,&local_e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
          __position._M_current =
               (this->GeneratedSourcesClasses).
               super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->GeneratedSourcesClasses).
              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>::
            _M_realloc_insert<cmSourceFile*const&>
                      ((vector<cmSourceFile*,std::allocator<cmSourceFile*>> *)
                       &this->GeneratedSourcesClasses,__position,&sf);
          }
          else {
            *__position._M_current = sf;
            pppcVar1 = &(this->GeneratedSourcesClasses).
                        super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            *pppcVar1 = *pppcVar1 + 1;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)no_main_dependency._M_dataplus._M_p != &no_main_dependency.field_2) {
            operator_delete(no_main_dependency._M_dataplus._M_p,
                            no_main_dependency.field_2._M_allocated_capacity + 1);
          }
          std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
                    (&commandLines.
                      super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&commandLine.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   );
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)cxxres._M_dataplus._M_p != &cxxres.field_2) {
            operator_delete(cxxres._M_dataplus._M_p,cxxres.field_2._M_allocated_capacity + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&depends);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)origname._M_dataplus._M_p != &origname.field_2) {
            operator_delete(origname._M_dataplus._M_p,origname.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)varName._M_dataplus._M_p != &varName.field_2) {
            operator_delete(varName._M_dataplus._M_p,varName.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sourceListValue._M_dataplus._M_p != &sourceListValue.field_2) {
            operator_delete(sourceListValue._M_dataplus._M_p,
                            sourceListValue.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          sourceListValue._M_dataplus._M_p = (pointer)&sourceListValue.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&sourceListValue,"WRAP_EXCLUDE","");
          bVar3 = cmSourceFile::GetPropertyAsBool(pcVar6,&sourceListValue);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sourceListValue._M_dataplus._M_p != &sourceListValue.field_2) {
            operator_delete(sourceListValue._M_dataplus._M_p,
                            sourceListValue.field_2._M_allocated_capacity + 1);
          }
          if (!bVar3) goto LAB_00320ea0;
        }
        psVar9 = psVar9 + 1;
      } while (psVar9 != (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish);
    }
    sourceListValue._M_dataplus._M_p = (pointer)&sourceListValue.field_2;
    sourceListValue._M_string_length = 0;
    sourceListValue.field_2._M_allocated_capacity =
         sourceListValue.field_2._M_allocated_capacity & 0xffffffffffffff00;
    lVar14 = (long)(this->GeneratedSourcesClasses).
                   super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->GeneratedSourcesClasses).
                   super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
    if (lVar14 != 0) {
      lVar14 = lVar14 >> 3;
      lVar11 = 0;
      lVar13 = 0;
      do {
        if (lVar13 == 0) {
          ppcVar8 = (this->GeneratedSourcesClasses).
                    super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
        }
        else {
          std::__cxx11::string::append((char *)&sourceListValue);
          ppcVar8 = (pointer)((long)(this->GeneratedSourcesClasses).
                                    super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar11);
        }
        psVar9 = cmSourceFile::GetFullPath(*ppcVar8,(string *)0x0);
        std::__cxx11::string::_M_append((char *)&sourceListValue,(ulong)(psVar9->_M_dataplus)._M_p);
        lVar13 = lVar13 + 1;
        lVar11 = lVar11 + 8;
      } while (lVar14 + (ulong)(lVar14 == 0) != lVar13);
    }
    pcVar2 = (this->Target)._M_dataplus._M_p;
    varName._M_dataplus._M_p = (pointer)&varName.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&varName,pcVar2,pcVar2 + (this->Target)._M_string_length);
    std::__cxx11::string::append((char *)&varName);
    cmMakefile::AddDefinition
              ((this->super_cmCommand).Makefile,&varName,sourceListValue._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)varName._M_dataplus._M_p != &varName.field_2) {
      operator_delete(varName._M_dataplus._M_p,varName.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sourceListValue._M_dataplus._M_p != &sourceListValue.field_2) {
      operator_delete(sourceListValue._M_dataplus._M_p,
                      sourceListValue.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)outputDirectory._M_dataplus._M_p != &outputDirectory.field_2) {
      operator_delete(outputDirectory._M_dataplus._M_p,
                      outputDirectory.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cdir._M_dataplus._M_p == &cdir.field_2) goto LAB_0032163f;
  }
  operator_delete(cdir._M_dataplus._M_p,cdir.field_2._M_allocated_capacity + 1);
LAB_0032163f:
  return 0x20 < uVar12;
}

Assistant:

bool cmFLTKWrapUICommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 2 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  // what is the current source dir
  std::string cdir = this->Makefile->GetCurrentSourceDirectory();
  const char* fluid_exe =
    this->Makefile->GetRequiredDefinition("FLTK_FLUID_EXECUTABLE");

  // get parameter for the command
  this->Target = args[0];  // Target that will use the generated files

  // get the list of GUI files from which .cxx and .h will be generated
  std::string outputDirectory = this->Makefile->GetCurrentBinaryDirectory();

  {
  // Some of the generated files are *.h so the directory "GUI"
  // where they are created have to be added to the include path
  std::vector<std::string> outputDirectories;
  outputDirectories.push_back(outputDirectory);
  this->Makefile->AddIncludeDirectories( outputDirectories );
  }

  for(std::vector<std::string>::const_iterator i = (args.begin() + 1);
      i != args.end(); i++)
    {
    cmSourceFile *curr = this->Makefile->GetSource(*i);
    // if we should use the source GUI
    // to generate .cxx and .h files
    if (!curr || !curr->GetPropertyAsBool("WRAP_EXCLUDE"))
      {
      std::string outName = outputDirectory;
      outName += "/";
      outName += cmSystemTools::GetFilenameWithoutExtension(*i);
      std::string hname = outName;
      hname += ".h";
      std::string origname = cdir + "/" + *i;
      // add starting depends
      std::vector<std::string> depends;
      depends.push_back(origname);
      depends.push_back(fluid_exe);
      std::string cxxres = outName;
      cxxres += ".cxx";

      cmCustomCommandLine commandLine;
      commandLine.push_back(fluid_exe);
      commandLine.push_back("-c"); // instructs Fluid to run in command line
      commandLine.push_back("-h"); // optionally rename .h files
      commandLine.push_back(hname);
      commandLine.push_back("-o"); // optionally rename .cxx files
      commandLine.push_back(cxxres);
      commandLine.push_back(origname);// name of the GUI fluid file
      cmCustomCommandLines commandLines;
      commandLines.push_back(commandLine);

      // Add command for generating the .h and .cxx files
      std::string no_main_dependency = "";
      const char* no_comment = 0;
      const char* no_working_dir = 0;
      this->Makefile->AddCustomCommandToOutput(cxxres,
                                           depends, no_main_dependency,
                                           commandLines, no_comment,
                                           no_working_dir);
      this->Makefile->AddCustomCommandToOutput(hname,
                                           depends, no_main_dependency,
                                           commandLines, no_comment,
                                           no_working_dir);

      cmSourceFile *sf = this->Makefile->GetSource(cxxres);
      sf->AddDepend(hname.c_str());
      sf->AddDepend(origname.c_str());
      this->GeneratedSourcesClasses.push_back(sf);
      }
    }

  // create the variable with the list of sources in it
  size_t lastHeadersClass = this->GeneratedSourcesClasses.size();
  std::string sourceListValue;
  for(size_t classNum = 0; classNum < lastHeadersClass; classNum++)
    {
    if (classNum)
      {
      sourceListValue += ";";
      }
    sourceListValue += this->GeneratedSourcesClasses[classNum]->GetFullPath();
    }
  std::string varName = this->Target;
  varName += "_FLTK_UI_SRCS";
  this->Makefile->AddDefinition(varName, sourceListValue.c_str());

  return true;
}